

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O1

int __thiscall FStateLabelStorage::AddPointer(FStateLabelStorage *this,FState *ptr)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  
  if (ptr != (FState *)0x0) {
    TArray<unsigned_char,_unsigned_char>::Grow(&this->Storage,0xc);
    uVar2 = (this->Storage).Count;
    lVar4 = (long)(int)uVar2;
    (this->Storage).Count = uVar2 + 0xc;
    puVar1 = (this->Storage).Array + lVar4;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(FState **)((this->Storage).Array + lVar4 + 4) = ptr;
    uVar3 = uVar2 + 3;
    if (-1 < lVar4) {
      uVar3 = uVar2;
    }
    return ((int)uVar3 >> 2) + 1;
  }
  return 0;
}

Assistant:

int AddPointer(FState *ptr)
	{
		if (ptr != nullptr)
		{
			int pos = Storage.Reserve(sizeof(ptr) + sizeof(int));
			memset(&Storage[pos], 0, sizeof(int));
			memcpy(&Storage[pos + sizeof(int)], &ptr, sizeof(ptr));
			return pos / 4 + 1;
		}
		else return 0;
	}